

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O0

void mbedtls_rsa_free(mbedtls_rsa_context *ctx)

{
  long in_RDI;
  
  if (in_RDI != 0) {
    mbedtls_mpi_free((mbedtls_mpi *)0x85dde1);
    mbedtls_mpi_free((mbedtls_mpi *)0x85ddf1);
    mbedtls_mpi_free((mbedtls_mpi *)0x85de01);
    mbedtls_mpi_free((mbedtls_mpi *)0x85de0e);
    mbedtls_mpi_free((mbedtls_mpi *)0x85de1b);
    mbedtls_mpi_free((mbedtls_mpi *)0x85de28);
    mbedtls_mpi_free((mbedtls_mpi *)0x85de35);
    mbedtls_mpi_free((mbedtls_mpi *)0x85de42);
    mbedtls_mpi_free((mbedtls_mpi *)0x85de52);
    mbedtls_mpi_free((mbedtls_mpi *)0x85de62);
    mbedtls_mpi_free((mbedtls_mpi *)0x85de72);
    mbedtls_mpi_free((mbedtls_mpi *)0x85de7f);
    mbedtls_mpi_free((mbedtls_mpi *)0x85de8c);
  }
  return;
}

Assistant:

void mbedtls_rsa_free(mbedtls_rsa_context *ctx)
{
    if (ctx == NULL) {
        return;
    }

    mbedtls_mpi_free(&ctx->Vi);
    mbedtls_mpi_free(&ctx->Vf);
    mbedtls_mpi_free(&ctx->RN);
    mbedtls_mpi_free(&ctx->D);
    mbedtls_mpi_free(&ctx->Q);
    mbedtls_mpi_free(&ctx->P);
    mbedtls_mpi_free(&ctx->E);
    mbedtls_mpi_free(&ctx->N);

#if !defined(MBEDTLS_RSA_NO_CRT)
    mbedtls_mpi_free(&ctx->RQ);
    mbedtls_mpi_free(&ctx->RP);
    mbedtls_mpi_free(&ctx->QP);
    mbedtls_mpi_free(&ctx->DQ);
    mbedtls_mpi_free(&ctx->DP);
#endif /* MBEDTLS_RSA_NO_CRT */

#if defined(MBEDTLS_THREADING_C)
    /* Free the mutex, but only if it hasn't been freed already. */
    if (ctx->ver != 0) {
        mbedtls_mutex_free(&ctx->mutex);
        ctx->ver = 0;
    }
#endif
}